

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocket::setSslConfiguration(QSslSocket *this,QSslConfiguration *configuration)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  QByteArray *pQVar4;
  bool bVar5;
  int iVar6;
  PeerVerifyMode PVar7;
  SslProtocol SVar8;
  NextProtocolNegotiationStatus NVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  QSslConfiguration::localCertificateChain((QList<QSslCertificate> *)&local_38,configuration);
  QArrayDataPointer<QSslCertificate>::operator=
            ((QArrayDataPointer<QSslCertificate> *)(lVar1 + 0x2c0),
             (QArrayDataPointer<QSslCertificate> *)&local_38);
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer
            ((QArrayDataPointer<QSslCertificate> *)&local_38);
  QSslConfiguration::privateKey((QSslConfiguration *)&local_38);
  QSslKey::operator=((QSslKey *)(lVar1 + 0x2d8),(QSslKey *)&local_38);
  QSslKey::~QSslKey((QSslKey *)&local_38);
  QSslConfiguration::ciphers((QList<QSslCipher> *)&local_38,configuration);
  QArrayDataPointer<QSslCipher>::operator=
            ((QArrayDataPointer<QSslCipher> *)(lVar1 + 0x2f0),
             (QArrayDataPointer<QSslCipher> *)&local_38);
  QArrayDataPointer<QSslCipher>::~QArrayDataPointer((QArrayDataPointer<QSslCipher> *)&local_38);
  QSslConfiguration::ellipticCurves((QList<QSslEllipticCurve> *)&local_38,configuration);
  QArrayDataPointer<QSslEllipticCurve>::operator=
            ((QArrayDataPointer<QSslEllipticCurve> *)(lVar1 + 0x338),
             (QArrayDataPointer<QSslEllipticCurve> *)&local_38);
  QArrayDataPointer<QSslEllipticCurve>::~QArrayDataPointer
            ((QArrayDataPointer<QSslEllipticCurve> *)&local_38);
  QSslConfiguration::preSharedKeyIdentityHint((QByteArray *)&local_38,configuration);
  pDVar3 = *(Data **)(lVar1 + 0x388);
  pQVar4 = *(QByteArray **)(lVar1 + 0x390);
  *(Data **)(lVar1 + 0x388) = local_38.d;
  *(QByteArray **)(lVar1 + 0x390) = local_38.ptr;
  qVar2 = *(qsizetype *)(lVar1 + 0x398);
  *(qsizetype *)(lVar1 + 0x398) = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pQVar4;
  local_38.size = qVar2;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
  QSslConfiguration::diffieHellmanParameters((QSslConfiguration *)&local_38);
  pDVar3 = *(Data **)(lVar1 + 0x350);
  *(Data **)(lVar1 + 0x350) = local_38.d;
  local_38.d = pDVar3;
  QSslDiffieHellmanParameters::~QSslDiffieHellmanParameters
            ((QSslDiffieHellmanParameters *)&local_38);
  QSslConfiguration::caCertificates((QList<QSslCertificate> *)&local_38,configuration);
  QArrayDataPointer<QSslCertificate>::operator=
            ((QArrayDataPointer<QSslCertificate> *)(lVar1 + 0x308),
             (QArrayDataPointer<QSslCertificate> *)&local_38);
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer
            ((QArrayDataPointer<QSslCertificate> *)&local_38);
  iVar6 = QSslConfiguration::peerVerifyDepth(configuration);
  *(int *)(lVar1 + 0x328) = iVar6;
  PVar7 = QSslConfiguration::peerVerifyMode(configuration);
  *(PeerVerifyMode *)(lVar1 + 0x324) = PVar7;
  SVar8 = QSslConfiguration::protocol(configuration);
  *(SslProtocol *)(lVar1 + 800) = SVar8;
  QSslConfiguration::backendConfiguration(configuration);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::operator=((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
               *)(lVar1 + 0x358),
              (QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
               *)&local_38);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QVariant,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QVariant>_>_>_>_>
              *)&local_38);
  *(Int *)(lVar1 + 0x330) =
       (((configuration->d).d.ptr)->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
       super_QFlagsStorage<QSsl::SslOption>.i;
  QSslConfiguration::sessionTicket((QByteArray *)&local_38,configuration);
  pDVar3 = *(Data **)(lVar1 + 0x360);
  pQVar4 = *(QByteArray **)(lVar1 + 0x368);
  *(Data **)(lVar1 + 0x360) = local_38.d;
  *(QByteArray **)(lVar1 + 0x368) = local_38.ptr;
  qVar2 = *(qsizetype *)(lVar1 + 0x370);
  *(qsizetype *)(lVar1 + 0x370) = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pQVar4;
  local_38.size = qVar2;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
  iVar6 = QSslConfiguration::sessionTicketLifeTimeHint(configuration);
  *(int *)(lVar1 + 0x378) = iVar6;
  QSslConfiguration::allowedNextProtocols((QList<QByteArray> *)&local_38,configuration);
  QArrayDataPointer<QByteArray>::operator=
            ((QArrayDataPointer<QByteArray> *)(lVar1 + 0x3a0),&local_38);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
  QSslConfiguration::nextNegotiatedProtocol((QByteArray *)&local_38,configuration);
  pDVar3 = *(Data **)(lVar1 + 0x3b8);
  pQVar4 = *(QByteArray **)(lVar1 + 0x3c0);
  *(Data **)(lVar1 + 0x3b8) = local_38.d;
  *(QByteArray **)(lVar1 + 0x3c0) = local_38.ptr;
  qVar2 = *(qsizetype *)(lVar1 + 0x3c8);
  *(qsizetype *)(lVar1 + 0x3c8) = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pQVar4;
  local_38.size = qVar2;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
  NVar9 = QSslConfiguration::nextProtocolNegotiationStatus(configuration);
  *(NextProtocolNegotiationStatus *)(lVar1 + 0x3d0) = NVar9;
  bVar5 = QSslConfiguration::ocspStaplingEnabled(configuration);
  *(bool *)(lVar1 + 0x3d5) = bVar5;
  bVar5 = QSslConfiguration::handshakeMustInterruptOnError(configuration);
  *(bool *)(lVar1 + 0x3d6) = bVar5;
  bVar5 = QSslConfiguration::missingCertificateIsFatal(configuration);
  *(bool *)(lVar1 + 0x3d7) = bVar5;
  if (((configuration->d).d.ptr)->allowRootCertOnDemandLoading == false) {
    *(undefined1 *)(lVar1 + 0x3f0) = 0;
    *(undefined1 *)(lVar1 + 0x32c) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setSslConfiguration(const QSslConfiguration &configuration)
{
    Q_D(QSslSocket);
    d->configuration.localCertificateChain = configuration.localCertificateChain();
    d->configuration.privateKey = configuration.privateKey();
    d->configuration.ciphers = configuration.ciphers();
    d->configuration.ellipticCurves = configuration.ellipticCurves();
    d->configuration.preSharedKeyIdentityHint = configuration.preSharedKeyIdentityHint();
    d->configuration.dhParams = configuration.diffieHellmanParameters();
    d->configuration.caCertificates = configuration.caCertificates();
    d->configuration.peerVerifyDepth = configuration.peerVerifyDepth();
    d->configuration.peerVerifyMode = configuration.peerVerifyMode();
    d->configuration.protocol = configuration.protocol();
    d->configuration.backendConfig = configuration.backendConfiguration();
    d->configuration.sslOptions = configuration.d->sslOptions;
    d->configuration.sslSession = configuration.sessionTicket();
    d->configuration.sslSessionTicketLifeTimeHint = configuration.sessionTicketLifeTimeHint();
    d->configuration.nextAllowedProtocols = configuration.allowedNextProtocols();
    d->configuration.nextNegotiatedProtocol = configuration.nextNegotiatedProtocol();
    d->configuration.nextProtocolNegotiationStatus = configuration.nextProtocolNegotiationStatus();
#if QT_CONFIG(ocsp)
    d->configuration.ocspStaplingEnabled = configuration.ocspStaplingEnabled();
#endif
#if QT_CONFIG(openssl)
    d->configuration.reportFromCallback = configuration.handshakeMustInterruptOnError();
    d->configuration.missingCertIsFatal = configuration.missingCertificateIsFatal();
#endif // openssl
    // if the CA certificates were set explicitly (either via
    // QSslConfiguration::setCaCertificates() or QSslSocket::setCaCertificates(),
    // we cannot load the certificates on demand
    if (!configuration.d->allowRootCertOnDemandLoading) {
        d->allowRootCertOnDemandLoading = false;
        d->configuration.allowRootCertOnDemandLoading = false;
    }
}